

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::PrintTo<ot::commissioner::Address_const,ot::commissioner::EnergyReport>
               (pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport> *value,
               ostream *os)

{
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_12,1);
  PrintBytesInObjectTo((uchar *)value,0x18,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  PrintBytesInObjectTo((uchar *)&value->second,0x30,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_11,1);
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}